

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

undefined8 __thiscall ev3dev::dc_motor::polarity_abi_cxx11_(dc_motor *this)

{
  undefined8 in_RDI;
  string *in_stack_00000060;
  device *in_stack_00000068;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"polarity",&local_31);
  device::get_attr_string(in_stack_00000068,in_stack_00000060);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

std::string polarity() const { return get_attr_string("polarity"); }